

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O2

void __thiscall
PathTracer::clear_target_images(PathTracer *this,shared_ptr<myvk::CommandPool> *command_pool)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  initializer_list<VkImageMemoryBarrier> __l;
  initializer_list<VkImageMemoryBarrier> __l_00;
  allocator_type local_179;
  shared_ptr<myvk::CommandBuffer> command_buffer;
  VkClearColorValue local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  _Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> local_148;
  _Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> local_128;
  shared_ptr<myvk::Fence> fence;
  VkImageMemoryBarrier local_100;
  VkImageMemoryBarrier local_b8;
  VkImageMemoryBarrier local_70;
  
  myvk::CommandBuffer::Create
            ((CommandBuffer *)&command_buffer,command_pool,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  iVar2 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  myvk::Fence::Create((Fence *)&fence,(Ptr<Device> *)CONCAT44(extraout_var,iVar2),0);
  myvk::CommandBuffer::Begin
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,1);
  peVar1 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_168._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_168._8_8_ = (element_type *)0x0;
  local_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_148._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::ImageBase::GetMemoryBarrier
            (&local_100,
             &((this->m_color_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_ImageBase,1,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,0xffffffff,0xffffffff);
  myvk::ImageBase::GetMemoryBarrier
            (&local_b8,
             &((this->m_albedo_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_ImageBase,1,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,0xffffffff,0xffffffff);
  myvk::ImageBase::GetMemoryBarrier
            (&local_70,
             &((this->m_normal_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_ImageBase,1,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,0xffffffff,0xffffffff);
  __l._M_len = 3;
  __l._M_array = &local_100;
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_128,__l,
             &local_179);
  myvk::CommandBuffer::CmdPipelineBarrier
            (peVar1,1,0x1000,(vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_168
             ,(vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_148,
             (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_128);
  std::_Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~_Vector_base
            (&local_128);
  std::_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~_Vector_base
            (&local_148);
  std::_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~_Vector_base
            ((_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_168);
  peVar1 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Image,void>
            ((__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2> *)&local_100,
             &(this->m_color_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>);
  local_168._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_168._8_8_ = (element_type *)0x0;
  myvk::CommandBuffer::CmdClearColorImage
            (peVar1,(Ptr<ImageBase> *)&local_100,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,&local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_100.pNext);
  peVar1 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Image,void>
            ((__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2> *)&local_100,
             &(this->m_albedo_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>);
  local_168._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_168._8_8_ = (element_type *)0x0;
  myvk::CommandBuffer::CmdClearColorImage
            (peVar1,(Ptr<ImageBase> *)&local_100,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,&local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_100.pNext);
  peVar1 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Image,void>
            ((__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2> *)&local_100,
             &(this->m_normal_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>);
  local_168._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_168._8_8_ = (element_type *)0x0;
  myvk::CommandBuffer::CmdClearColorImage
            (peVar1,(Ptr<ImageBase> *)&local_100,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,&local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_100.pNext);
  peVar1 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_168._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_168._8_8_ = (element_type *)0x0;
  local_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_148._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::ImageBase::GetMemoryBarrier
            (&local_100,
             &((this->m_color_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_ImageBase,1,0x1000,0,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             VK_IMAGE_LAYOUT_GENERAL,0xffffffff,0xffffffff);
  myvk::ImageBase::GetMemoryBarrier
            (&local_b8,
             &((this->m_albedo_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_ImageBase,1,0x1000,0,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             VK_IMAGE_LAYOUT_GENERAL,0xffffffff,0xffffffff);
  myvk::ImageBase::GetMemoryBarrier
            (&local_70,
             &((this->m_normal_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_ImageBase,1,0x1000,0,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             VK_IMAGE_LAYOUT_GENERAL,0xffffffff,0xffffffff);
  __l_00._M_len = 3;
  __l_00._M_array = &local_100;
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_128,
             __l_00,&local_179);
  myvk::CommandBuffer::CmdPipelineBarrier
            (peVar1,0x1000,0x2000,
             (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_168,
             (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_148,
             (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_128);
  std::_Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~_Vector_base
            (&local_128);
  std::_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~_Vector_base
            (&local_148);
  std::_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~_Vector_base
            ((_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_168);
  myvk::CommandBuffer::End
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  myvk::CommandBuffer::Submit
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&fence);
  myvk::Fence::Wait(fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    0xffffffffffffffff);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void PathTracer::clear_target_images(const std::shared_ptr<myvk::CommandPool> &command_pool) {
	std::shared_ptr<myvk::CommandBuffer> command_buffer = myvk::CommandBuffer::Create(command_pool);
	std::shared_ptr<myvk::Fence> fence = myvk::Fence::Create(command_pool->GetDevicePtr());
	command_buffer->Begin(VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT);
	command_buffer->CmdPipelineBarrier(
	    VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, {}, {},
	    {m_color_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, 0, VK_ACCESS_TRANSFER_WRITE_BIT,
	                                     VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL),
	     m_albedo_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, 0, VK_ACCESS_TRANSFER_WRITE_BIT,
	                                      VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL),
	     m_normal_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, 0, VK_ACCESS_TRANSFER_WRITE_BIT,
	                                      VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL)});

	command_buffer->CmdClearColorImage(m_color_image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
	command_buffer->CmdClearColorImage(m_albedo_image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
	command_buffer->CmdClearColorImage(m_normal_image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);

	command_buffer->CmdPipelineBarrier(
	    VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT, {}, {},
	    {m_color_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, VK_ACCESS_TRANSFER_WRITE_BIT, 0,
	                                     VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, VK_IMAGE_LAYOUT_GENERAL),
	     m_albedo_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, VK_ACCESS_TRANSFER_WRITE_BIT, 0,
	                                      VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, VK_IMAGE_LAYOUT_GENERAL),
	     m_normal_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, VK_ACCESS_TRANSFER_WRITE_BIT, 0,
	                                      VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, VK_IMAGE_LAYOUT_GENERAL)});
	command_buffer->End();

	command_buffer->Submit(fence);
	fence->Wait();
}